

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__compute_huffman_codes(stbi__zbuf *a)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int c;
  int s;
  int hclen;
  int hdist;
  int hlit;
  int n;
  int i;
  stbi_uc codelength_sizes [19];
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  int in_stack_fffffffffffff5fc;
  uint in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff604;
  int local_9f0;
  int local_9ec;
  undefined1 local_9e8 [32];
  byte local_9c8 [100];
  int in_stack_fffffffffffff69c;
  stbi_uc *in_stack_fffffffffffff6a0;
  stbi__zhuffman *in_stack_fffffffffffff6a8;
  int local_4;
  
  uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600)
                         ,in_stack_fffffffffffff5fc);
  iVar2 = uVar1 + 0x101;
  uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600)
                         ,in_stack_fffffffffffff5fc);
  iVar3 = uVar1 + 1;
  uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600)
                         ,in_stack_fffffffffffff5fc);
  iVar4 = uVar1 + 4;
  memset(local_9e8,0,0x13);
  for (local_9ec = 0; local_9ec < iVar4; local_9ec = local_9ec + 1) {
    in_stack_fffffffffffff600 =
         stbi__zreceive((stbi__zbuf *)CONCAT44(iVar4,in_stack_fffffffffffff600),
                        in_stack_fffffffffffff5fc);
    local_9e8[stbi__compute_huffman_codes::length_dezigzag[local_9ec]] =
         (char)in_stack_fffffffffffff600;
  }
  iVar5 = stbi__zbuild_huffman
                    (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  if (iVar5 == 0) {
    local_4 = 0;
  }
  else {
    local_9f0 = 0;
    while (local_9f0 < iVar2 + iVar3) {
      iVar5 = stbi__zhuffman_decode
                        ((stbi__zbuf *)CONCAT44(iVar2,iVar3),
                         (stbi__zhuffman *)CONCAT44(iVar4,in_stack_fffffffffffff600));
      if ((iVar5 < 0) || (0x12 < iVar5)) {
        iVar2 = stbi__err("bad codelengths");
        return iVar2;
      }
      if (iVar5 < 0x10) {
        local_9c8[local_9f0] = (byte)iVar5;
        local_9f0 = local_9f0 + 1;
      }
      else {
        if (iVar5 == 0x10) {
          uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT44(iVar4,in_stack_fffffffffffff600),0x10);
          iVar5 = uVar1 + 3;
          memset(local_9c8 + local_9f0,(uint)local_9c8[local_9f0 + -1],(long)iVar5);
        }
        else if (iVar5 == 0x11) {
          uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT44(iVar4,in_stack_fffffffffffff600),0x11);
          iVar5 = uVar1 + 3;
          memset(local_9c8 + local_9f0,0,(long)iVar5);
        }
        else {
          uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT44(iVar4,in_stack_fffffffffffff600),iVar5);
          iVar5 = uVar1 + 0xb;
          memset(local_9c8 + local_9f0,0,(long)iVar5);
        }
        local_9f0 = iVar5 + local_9f0;
      }
    }
    if (local_9f0 == iVar2 + iVar3) {
      iVar2 = stbi__zbuild_huffman
                        (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                         in_stack_fffffffffffff69c);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        iVar2 = stbi__zbuild_huffman
                          (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                           in_stack_fffffffffffff69c);
        if (iVar2 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = stbi__err("bad codelengths");
    }
  }
  return local_4;
}

Assistant:

static int stbi__compute_huffman_codes(stbi__zbuf *a)
{
   static stbi_uc length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
   stbi__zhuffman z_codelength;
   stbi_uc lencodes[286+32+137];//padding for maximum single op
   stbi_uc codelength_sizes[19];
   int i,n;

   int hlit  = stbi__zreceive(a,5) + 257;
   int hdist = stbi__zreceive(a,5) + 1;
   int hclen = stbi__zreceive(a,4) + 4;

   memset(codelength_sizes, 0, sizeof(codelength_sizes));
   for (i=0; i < hclen; ++i) {
      int s = stbi__zreceive(a,3);
      codelength_sizes[length_dezigzag[i]] = (stbi_uc) s;
   }
   if (!stbi__zbuild_huffman(&z_codelength, codelength_sizes, 19)) return 0;

   n = 0;
   while (n < hlit + hdist) {
      int c = stbi__zhuffman_decode(a, &z_codelength);
      if (c < 0 || c >= 19) return stbi__err("bad codelengths", "Corrupt PNG");
      if (c < 16)
         lencodes[n++] = (stbi_uc) c;
      else if (c == 16) {
         c = stbi__zreceive(a,2)+3;
         memset(lencodes+n, lencodes[n-1], c);
         n += c;
      } else if (c == 17) {
         c = stbi__zreceive(a,3)+3;
         memset(lencodes+n, 0, c);
         n += c;
      } else {
         STBI_ASSERT(c == 18);
         c = stbi__zreceive(a,7)+11;
         memset(lencodes+n, 0, c);
         n += c;
      }
   }
   if (n != hlit+hdist) return stbi__err("bad codelengths","Corrupt PNG");
   if (!stbi__zbuild_huffman(&a->z_length, lencodes, hlit)) return 0;
   if (!stbi__zbuild_huffman(&a->z_distance, lencodes+hlit, hdist)) return 0;
   return 1;
}